

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_wave_match(Impl *this,SPIRVModule *module,Id type_id)

{
  Op OVar1;
  Instruction *this_00;
  pointer this_01;
  Id IVar2;
  Id IVar3;
  pointer ppVar4;
  Function *pFVar5;
  Block *pBVar6;
  Block *pBVar7;
  Block *this_02;
  Id IVar8;
  Builder *pBVar9;
  Instruction *local_118;
  Id local_10c;
  Id uvec4_type;
  Id type_id_local;
  Builder *local_100;
  Instruction *local_f8;
  Instruction *local_f0;
  uint local_e4;
  Op equal_op;
  Id bool_type;
  Block *local_d8;
  Block *local_d0;
  Block *local_c8;
  Block *entry;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_b8;
  Block *local_98;
  Function *local_90;
  Block *local_88;
  vector<std::pair<unsigned_int,unsigned_int>,dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,unsigned_int>>>
  *local_80;
  Block *local_78;
  undefined4 local_6c;
  Vector<spv::Id> types;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  local_80 = (vector<std::pair<unsigned_int,unsigned_int>,dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,unsigned_int>>>
              *)&this->wave_match_call_ids;
  for (ppVar4 = (this->wave_match_call_ids).
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 != (this->wave_match_call_ids).
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
    if (ppVar4->first == type_id) {
      return ppVar4->second;
    }
  }
  pBVar9 = &this->builder;
  local_88 = (this->builder).buildPoint;
  type_id_local = type_id;
  spv::Builder::addCapability(pBVar9,CapabilityGroupNonUniform);
  spv::Builder::addCapability(pBVar9,CapabilityGroupNonUniformBallot);
  entry = (Block *)0x0;
  IVar2 = spv::Builder::makeUintType(pBVar9,0x20);
  IVar2 = spv::Builder::makeVectorType(pBVar9,IVar2,4);
  uvec4_type = IVar2;
  bool_type = spv::Builder::makeBoolType(pBVar9);
  local_b8.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_b8.
                         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,type_id);
  types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&types,&local_b8);
  if (this->helper_lanes_participate_in_wave_ops == false) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
              (&types,&bool_type);
  }
  local_b8.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar5 = spv::Builder::makeFunctionEntry
                     (pBVar9,DecorationMax,IVar2,"WaveMatch",&types,&local_b8,&entry);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector(&local_b8);
  IVar3 = (*(pFVar5->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start)->resultId;
  pBVar6 = (Block *)allocate_in_thread(0x78);
  IVar8 = (this->builder).uniqueId + 1;
  (this->builder).uniqueId = IVar8;
  spv::Block::Block(pBVar6,IVar8,pFVar5);
  local_78 = (Block *)allocate_in_thread(0x78);
  IVar8 = (this->builder).uniqueId + 1;
  (this->builder).uniqueId = IVar8;
  spv::Block::Block(local_78,IVar8,pFVar5);
  pBVar7 = (Block *)allocate_in_thread(0x78);
  IVar8 = (this->builder).uniqueId + 1;
  (this->builder).uniqueId = IVar8;
  spv::Block::Block(pBVar7,IVar8,pFVar5);
  (this->builder).buildPoint = entry;
  spv::Builder::createBranch(pBVar9,pBVar6);
  (this->builder).buildPoint = pBVar6;
  local_90 = pFVar5;
  if (this->helper_lanes_participate_in_wave_ops == false) {
    local_d8 = pBVar6;
    pBVar6 = (Block *)allocate_in_thread(0x78);
    IVar8 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar8;
    spv::Block::Block(pBVar6,IVar8,pFVar5);
    this_02 = (Block *)allocate_in_thread(0x78);
    local_100 = (Builder *)CONCAT44(local_100._4_4_,IVar2);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    spv::Block::Block(this_02,IVar2,pFVar5);
    local_10c = spv::Builder::createUndefined(pBVar9,(Id)local_100);
    spv::Builder::createSelectionMerge(pBVar9,pBVar6,0);
    local_c8 = pBVar6;
    spv::Builder::createConditionalBranch
              (pBVar9,(pFVar5->parameterInstructions).
                      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]->resultId,pBVar6,this_02);
    (this->builder).buildPoint = this_02;
    local_d0 = this_02;
  }
  else {
    local_c8 = (Block *)0x0;
    local_d8 = (Block *)0x0;
    local_10c = 0;
    local_d0 = pBVar6;
  }
  pBVar6 = local_78;
  local_98 = pBVar7;
  spv::Builder::createLoopMerge(pBVar9,pBVar7,local_78,0);
  spv::Builder::createBranch(pBVar9,pBVar6);
  IVar2 = (this->builder).uniqueId + 1;
  (this->builder).uniqueId = IVar2;
  local_f0 = (Instruction *)CONCAT44(local_f0._4_4_,IVar2);
  local_118._0_4_ = 0x152;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_b8,(uint *)&local_f0,&type_id_local);
  this_01 = local_b8.
            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  IVar2 = spv::Builder::makeUintConstant(pBVar9,3,false);
  spv::Instruction::addIdOperand((Instruction *)this_01,IVar2);
  spv::Instruction::addIdOperand
            ((Instruction *)
             local_b8.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,IVar3);
  OVar1 = (this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start[type_id_local]->opCode;
  if (OVar1 != OpTypeFloat) {
    equal_op = OpIEqual;
    if (OVar1 == OpTypeBool) {
      equal_op = OpLogicalEqual;
    }
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    local_118 = (Instruction *)CONCAT44(local_118._4_4_,IVar2);
    local_f8._0_4_ = spv::Builder::makeBoolType(pBVar9);
    local_100 = pBVar9;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op&>
              ((uint *)&local_f0,(uint *)&local_118,(Op *)&local_f8);
    spv::Instruction::addIdOperand(local_f0,IVar3);
    spv::Instruction::addIdOperand
              (local_f0,*(Id *)((long)local_b8.
                                      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 8));
    pBVar9 = local_100;
    IVar2 = local_f0->resultId;
    IVar3 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar3;
    local_f8 = (Instruction *)CONCAT44(local_f8._4_4_,IVar3);
    local_e4 = 0x153;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_118,(uint *)&local_f8,&uvec4_type);
    this_00 = local_118;
    IVar3 = spv::Builder::makeUintConstant(pBVar9,3,false);
    spv::Instruction::addIdOperand(this_00,IVar3);
    spv::Instruction::addIdOperand(local_118,local_f0->resultId);
    IVar3 = local_118->resultId;
    (this->builder).buildPoint = pBVar6;
    local_38._M_head_impl =
         (Instruction *)
         local_b8.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    add_instruction(this,pBVar6,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_38);
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    local_40._M_head_impl = local_f0;
    local_f0 = (Instruction *)0x0;
    add_instruction(this,pBVar6,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    local_48._M_head_impl = local_118;
    local_118 = (Instruction *)0x0;
    add_instruction(this,pBVar6,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_48);
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
    pBVar7 = local_98;
    spv::Builder::createConditionalBranch(pBVar9,IVar2,local_98,local_d0);
    pBVar6 = local_c8;
    (this->builder).buildPoint = pBVar7;
    if (local_c8 != (Block *)0x0) {
      spv::Builder::createBranch(pBVar9,local_c8);
      (this->builder).buildPoint = pBVar6;
      local_e4 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = local_e4;
      local_6c = 0xf5;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_f8,&local_e4,&uvec4_type);
      spv::Instruction::addIdOperand(local_f8,IVar3);
      spv::Instruction::addIdOperand
                (local_f8,*(Id *)((long)(((pBVar7->instructions).
                                          super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                        ._M_t + 8));
      spv::Instruction::addIdOperand(local_f8,local_10c);
      spv::Instruction::addIdOperand
                (local_f8,*(Id *)((long)(((local_d8->instructions).
                                          super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                        ._M_t + 8));
      IVar3 = local_f8->resultId;
      local_50._M_head_impl = local_f8;
      local_f8 = (Instruction *)0x0;
      add_instruction(this,pBVar6,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_50);
      if (local_50._M_head_impl != (Instruction *)0x0) {
        (*(local_50._M_head_impl)->_vptr_Instruction[1])();
      }
      pBVar9 = local_100;
      if (local_f8 != (Instruction *)0x0) {
        (*local_f8->_vptr_Instruction[1])();
        pBVar9 = local_100;
      }
    }
    spv::Builder::makeReturn(pBVar9,false,IVar3);
    pFVar5 = local_90;
    (this->builder).buildPoint = local_88;
    local_f8 = (Instruction *)CONCAT44(local_f8._4_4_,(local_90->functionInstruction).resultId);
    std::
    vector<std::pair<unsigned_int,unsigned_int>,dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<unsigned_int&,unsigned_int>(local_80,&type_id_local,(uint *)&local_f8);
    IVar2 = (pFVar5->functionInstruction).resultId;
    if (local_118 != (Instruction *)0x0) {
      (*local_118->_vptr_Instruction[1])();
    }
    if (local_f0 != (Instruction *)0x0) {
      (*local_f0->_vptr_Instruction[1])();
    }
    if (local_b8.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_b8.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&types.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
    return IVar2;
  }
  __assert_fail("builder.getTypeClass(type_id) != spv::OpTypeFloat",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/spirv_module.cpp"
                ,0x423,
                "spv::Id dxil_spv::SPIRVModule::Impl::build_wave_match(SPIRVModule &, spv::Id)");
}

Assistant:

spv::Id SPIRVModule::Impl::build_wave_match(SPIRVModule &module, spv::Id type_id)
{
	for (auto &type : wave_match_call_ids)
		if (type.first == type_id)
			return type.second;

	auto *current_build_point = builder.getBuildPoint();
	builder.addCapability(spv::CapabilityGroupNonUniform);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec4_type = builder.makeVectorType(uint_type, 4);
	spv::Id bool_type = builder.makeBoolType();
	Vector<spv::Id> types = { type_id };
	if (!helper_lanes_participate_in_wave_ops)
		types.push_back(bool_type);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uvec4_type,
	                                       "WaveMatch",
	                                       types, {}, &entry);
	spv::Id value_id = func->getParamId(0);

	auto *header_block = new spv::Block(builder.getUniqueId(), *func);
	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	spv::Block *outer_header = nullptr;
	spv::Block *return_block = nullptr;
	spv::Id undef_id = 0;

	builder.setBuildPoint(entry);
	builder.createBranch(header_block);
	builder.setBuildPoint(header_block);

	if (!helper_lanes_participate_in_wave_ops)
	{
		return_block = new spv::Block(builder.getUniqueId(), *func);
		auto *inner_header_block = new spv::Block(builder.getUniqueId(), *func);
		undef_id = builder.createUndefined(uvec4_type);
		builder.createSelectionMerge(return_block, 0);
		builder.createConditionalBranch(func->getParamId(1), return_block, inner_header_block);
		outer_header = header_block;
		header_block = inner_header_block;
		builder.setBuildPoint(header_block);
	}

	builder.createLoopMerge(merge_block, body_block, 0);
	builder.createBranch(body_block);

	auto broadcast_first = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpGroupNonUniformBroadcastFirst);
	broadcast_first->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	broadcast_first->addIdOperand(value_id);

	// We cannot scalarize floats safely due to NaNs. Caller will bitcast to uint first.
	assert(builder.getTypeClass(type_id) != spv::OpTypeFloat);
	spv::Op equal_op;
	if (builder.getTypeClass(type_id) == spv::OpTypeBool)
		equal_op = spv::OpLogicalEqual;
	else
		equal_op = spv::OpIEqual;

	auto compare = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeBoolType(), equal_op);
	compare->addIdOperand(value_id);
	compare->addIdOperand(broadcast_first->getResultId());
	spv::Id compare_id = compare->getResultId();

	auto ballot = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBallot);
	ballot->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	ballot->addIdOperand(compare->getResultId());
	spv::Id ballot_id = ballot->getResultId();

	builder.setBuildPoint(body_block);
	add_instruction(body_block, std::move(broadcast_first));
	add_instruction(body_block, std::move(compare));
	add_instruction(body_block, std::move(ballot));
	builder.createConditionalBranch(compare_id, merge_block, header_block);

	builder.setBuildPoint(merge_block);

	if (return_block)
	{
		builder.createBranch(return_block);
		builder.setBuildPoint(return_block);

		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpPhi);
		phi->addIdOperand(ballot_id);
		phi->addIdOperand(merge_block->getId());
		phi->addIdOperand(undef_id);
		phi->addIdOperand(outer_header->getId());
		ballot_id = phi->getResultId();
		add_instruction(return_block, std::move(phi));
	}

	builder.makeReturn(false, ballot_id);
	builder.setBuildPoint(current_build_point);

	wave_match_call_ids.emplace_back(type_id, func->getId());
	return func->getId();
}